

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

void bmGateWay(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int p_equivalence)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t **vPiValues;
  Vec_Int_t *pVVar6;
  Abc_Ntk_t *pAVar7;
  Abc_Ntk_t *pNtk;
  abctime aVar8;
  Vec_Ptr_t **ppVVar9;
  undefined4 in_register_00000014;
  byte bVar10;
  size_t __size;
  Vec_Int_t **ppVVar11;
  char *pNtk_00;
  size_t __size_00;
  long lVar12;
  Vec_Int_t **ppVVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  Vec_Int_t **in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffea0;
  int *piVar17;
  int *oLastItem2_00;
  int oLastItem1;
  Abc_Ntk_t *local_100;
  Abc_Ntk_t *local_f8;
  int oLastItem2;
  int iLastItem1;
  Vec_Int_t **local_e8;
  Vec_Int_t **local_e0;
  ulong local_d8;
  Vec_Int_t **local_d0;
  int iLastItem2;
  Vec_Int_t **local_c0;
  Vec_Int_t **local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  Vec_Ptr_t **local_90;
  Vec_Int_t **local_88;
  Vec_Int_t **local_80;
  int *local_78;
  char *local_70;
  Vec_Int_t **local_68;
  int *local_60;
  float local_54;
  Vec_Ptr_t **local_50;
  int local_44;
  abctime local_40;
  ulong local_38;
  
  local_d8 = CONCAT44(in_register_00000014,p_equivalence);
  local_90 = (Vec_Ptr_t **)Abc_Clock();
  uVar1 = pNtk1->vPis->nSize;
  uVar14 = (ulong)uVar1;
  local_60 = (int *)(long)(int)uVar1;
  local_70 = (char *)(uVar14 * 8);
  local_c0 = (Vec_Int_t **)malloc((size_t)local_70);
  uVar1 = pNtk1->vPos->nSize;
  __size = (ulong)uVar1 << 3;
  local_68 = (Vec_Int_t **)malloc(__size);
  uVar2 = pNtk2->vPis->nSize;
  local_78 = (int *)(ulong)uVar2;
  local_100 = (Abc_Ntk_t *)(long)(int)uVar2;
  local_e0 = (Vec_Int_t **)((long)local_78 * 8);
  local_d0 = (Vec_Int_t **)malloc((size_t)local_e0);
  uVar2 = pNtk2->vPos->nSize;
  __size_00 = (ulong)uVar2 << 3;
  local_f8 = pNtk2;
  local_e8 = (Vec_Int_t **)malloc(__size_00);
  local_b8 = (Vec_Int_t **)malloc((size_t)local_70);
  local_88 = (Vec_Int_t **)malloc(__size);
  local_e0 = (Vec_Int_t **)malloc((size_t)local_e0);
  local_80 = (Vec_Int_t **)malloc(__size_00);
  piVar17 = local_60;
  local_a8 = (int *)malloc((long)local_60 * 4);
  local_b0 = (int *)malloc((long)(int)uVar1 << 2);
  pAVar7 = local_100;
  local_98 = (int *)malloc((long)local_100 * 4);
  local_a0 = (int *)malloc((long)(int)uVar2 << 2);
  local_70 = (char *)malloc((long)piVar17 + 1);
  local_70[(long)piVar17] = '\0';
  vPiValues = (Vec_Int_t **)malloc((long)pAVar7 + 1);
  *(char *)((long)vPiValues + (long)pAVar7) = '\0';
  local_60 = (int *)malloc(uVar14 << 2);
  local_78 = (int *)malloc((long)local_78 << 2);
  for (lVar12 = 0; ppVVar13 = local_68, ppVVar11 = local_e8, lVar12 < (int)uVar14;
      lVar12 = lVar12 + 1) {
    pVVar6 = Vec_IntAlloc(1);
    local_c0[lVar12] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    local_b8[lVar12] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    local_d0[lVar12] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    local_e0[lVar12] = pVVar6;
    local_60[lVar12] = 0;
    local_70[lVar12] = '0';
    local_78[lVar12] = 0;
    *(char *)((long)vPiValues + lVar12) = '0';
    uVar14 = (ulong)(uint)pNtk1->vPis->nSize;
  }
  iVar3 = 1;
  for (lVar12 = 0; lVar12 < pNtk1->vPos->nSize; lVar12 = lVar12 + 1) {
    pVVar6 = Vec_IntAlloc(1);
    ppVVar13[lVar12] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    local_88[lVar12] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    ppVVar11[lVar12] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    local_80[lVar12] = pVVar6;
  }
  pAVar7 = Abc_NtkStrash(pNtk1,0,0,0);
  pNtk = Abc_NtkStrash(local_f8,0,0,0);
  puts("Network  strashing is done!");
  ppVVar11 = local_c0;
  getDependencies(pAVar7,local_c0,ppVVar13);
  getDependencies(pNtk,local_d0,local_e8);
  puts("Getting dependencies is done!");
  iVar5 = (int)local_d8;
  local_100 = pAVar7;
  initMatchList(pAVar7,ppVVar11,ppVVar13,local_b8,&iLastItem1,local_88,&oLastItem1,local_a8,local_b0
                ,iVar5);
  ppVVar11 = local_e8;
  local_f8 = pNtk;
  initMatchList(pNtk,local_d0,local_e8,local_e0,&iLastItem2,local_80,&oLastItem2,local_98,local_a0,
                iVar5);
  puts("Initializing match lists is done!");
  iVar5 = oLastItem1;
  local_d8 = (ulong)(uint)iLastItem1;
  if ((iLastItem1 == iLastItem2) && (oLastItem1 == oLastItem2)) {
    pNtk_00 = "Refining IOs by dependencies ...";
    printf("Refining IOs by dependencies ...");
    ppVVar13 = local_68;
    ppVVar11 = local_e8;
    iVar4 = 1;
    do {
      if (iVar4 != 0) {
        iSortDependencies(local_100,local_c0,local_b0);
        pNtk_00 = (char *)local_f8;
        iSortDependencies(local_f8,local_d0,local_a0);
      }
      pAVar7 = local_100;
      if (iVar3 != 0) {
        oSortDependencies(local_100,ppVVar13,local_a8);
        pNtk_00 = (char *)local_f8;
        oSortDependencies(local_f8,ppVVar11,local_98);
      }
      if (((int)local_d8 < pAVar7->vPis->nSize) &&
         (iSplitByDep((Abc_Ntk_t *)pNtk_00,local_c0,local_b8,local_a8,&iLastItem1,local_b0),
         iVar5 < pAVar7->vPos->nSize)) {
        oSplitByDep((Abc_Ntk_t *)pNtk_00,ppVVar13,local_88,local_b0,&oLastItem1,local_a8);
      }
      iVar4 = 0;
      iVar3 = 0;
      if ((int)local_d8 < local_f8->vPis->nSize) {
        iVar3 = iSplitByDep((Abc_Ntk_t *)pNtk_00,local_d0,local_e0,local_98,&iLastItem2,local_a0);
      }
      if (iVar5 < local_f8->vPos->nSize) {
        iVar4 = oSplitByDep((Abc_Ntk_t *)pNtk_00,local_e8,local_80,local_a0,&oLastItem2,local_98);
        iVar5 = oLastItem2;
      }
      local_d8 = (ulong)(uint)iLastItem1;
      if ((iLastItem1 != iLastItem2) || (oLastItem1 != iVar5)) {
        fwrite("I/O dependencies of two circuits are different.\n",0x30,1,_stdout);
        local_50 = (Vec_Ptr_t **)0x0;
        local_90 = (Vec_Ptr_t **)0x0;
        ppVVar11 = local_e8;
        pAVar7 = local_100;
        goto LAB_002306e3;
      }
    } while (iVar3 != 0 || iVar4 != 0);
    puts(" done!");
    aVar8 = Abc_Clock();
    local_54 = (float)(aVar8 - (long)local_90) / 1e+06;
    local_40 = Abc_Clock();
    pAVar7 = local_100;
    ppVVar9 = findTopologicalOrder(local_100);
    local_90 = findTopologicalOrder(local_f8);
    printf("Refining IOs by simulation ...");
    iVar3 = 0;
    local_50 = ppVVar9;
    do {
      local_38 = 0;
      if (0 < (int)local_d8) {
        local_38 = local_d8 & 0xffffffff;
      }
      local_44 = iVar3;
      for (uVar14 = 0; uVar14 != local_38; uVar14 = uVar14 + 1) {
        rand();
        rand();
        iVar5 = rand();
        pVVar6 = local_b8[uVar14];
        iVar3 = pVVar6->nSize;
        p = local_e0[uVar14];
        if (iVar3 != p->nSize) {
          fwrite("Input refinement by simulation finds two circuits different.\n",0x3d,1,_stdout);
          ppVVar11 = local_e8;
          pAVar7 = local_100;
          ppVVar13 = local_68;
          goto LAB_002306e3;
        }
        bVar10 = (byte)iVar5 & 1 | 0x30;
        for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
          iVar3 = Vec_IntEntry(pVVar6,iVar5);
          local_70[iVar3] = bVar10;
          iVar3 = Vec_IntEntry(p,iVar5);
          *(byte *)((long)vPiValues + (long)iVar3) = bVar10;
          iVar3 = pVVar6->nSize;
        }
        pAVar7 = local_100;
        ppVVar13 = local_68;
        ppVVar9 = local_50;
      }
      iVar5 = refineIOBySimulation
                        (pAVar7,local_b8,&iLastItem1,local_a8,local_c0,local_88,&oLastItem1,local_b0
                         ,ppVVar13,local_70,local_60,ppVVar9);
      piVar17 = &oLastItem2;
      ppVVar11 = vPiValues;
      oLastItem2_00 = local_78;
      iVar4 = refineIOBySimulation
                        (local_f8,local_e0,&iLastItem2,local_98,local_d0,local_80,piVar17,local_a0,
                         local_e8,(char *)vPiValues,local_78,local_90);
      iVar3 = local_44 + 1;
      if (iVar4 != 0) {
        iVar3 = 0;
      }
      if (iVar5 == 0) {
        iVar3 = local_44 + 1;
      }
      local_d8 = (ulong)(uint)iLastItem1;
      if (((iVar5 != iVar4) || (iLastItem1 != iLastItem2)) || (oLastItem1 != oLastItem2)) {
        fwrite("Input refinement by simulation finds two circuits different.\n",0x3d,1,_stdout);
        ppVVar11 = local_e8;
        goto LAB_002306e3;
      }
    } while (iVar3 < 0xc9);
    puts(" done!");
    aVar8 = Abc_Clock();
    local_100 = (Abc_Ntk_t *)CONCAT44(local_100._4_4_,(float)(aVar8 - local_40) / 1e+06);
    puts("SAT-based search started ...");
    fVar16 = refineBySAT(pAVar7,local_b8,local_a8,local_c0,&iLastItem1,local_88,local_b0,
                         in_stack_fffffffffffffe90,&oLastItem1,in_stack_fffffffffffffea0,local_f8,
                         local_e0,local_98,local_d0,piVar17,local_80,local_a0,ppVVar11,oLastItem2_00
                         ,local_78);
    local_f8 = (Abc_Ntk_t *)CONCAT44(local_f8._4_4_,fVar16);
    printf("Init Time = %4.2f\n",(double)local_54);
    printf("Simulation Time = %4.2f\n",(double)local_100._0_4_);
    printf("SAT Time = %4.2f\n",(double)local_f8._0_4_);
    printf("Overall Time = %4.2f\n",(double)(local_100._0_4_ + local_54 + local_f8._0_4_));
    ppVVar11 = local_e8;
  }
  else {
    fwrite("I/O dependencies of two circuits are different.\n",0x30,1,_stdout);
    local_50 = (Vec_Ptr_t **)0x0;
    local_90 = (Vec_Ptr_t **)0x0;
    pAVar7 = local_100;
    ppVVar13 = local_68;
  }
LAB_002306e3:
  uVar15 = 0;
  uVar14 = local_d8 & 0xffffffff;
  if ((int)local_d8 < 1) {
    uVar14 = uVar15;
  }
  for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
    Vec_IntFree(local_b8[uVar15]);
    Vec_IntFree(local_e0[uVar15]);
  }
  uVar15 = 0;
  uVar14 = (ulong)(uint)oLastItem1;
  if (oLastItem1 < 1) {
    uVar14 = uVar15;
  }
  for (; ppVVar9 = local_50, uVar14 != uVar15; uVar15 = uVar15 + 1) {
    Vec_IntFree(local_88[uVar15]);
    Vec_IntFree(local_80[uVar15]);
  }
  for (lVar12 = 0; lVar12 < pAVar7->vPis->nSize; lVar12 = lVar12 + 1) {
    Vec_IntFree(local_c0[lVar12]);
    Vec_IntFree(local_d0[lVar12]);
    if (ppVVar9 != (Vec_Ptr_t **)0x0) {
      Vec_PtrFree(ppVVar9[lVar12]);
      Vec_PtrFree(local_90[lVar12]);
    }
  }
  for (lVar12 = 0; lVar12 < pAVar7->vPos->nSize; lVar12 = lVar12 + 1) {
    Vec_IntFree(ppVVar13[lVar12]);
    Vec_IntFree(ppVVar11[lVar12]);
  }
  free(local_b8);
  free(local_e0);
  free(local_88);
  free(local_80);
  free(local_c0);
  free(local_d0);
  free(ppVVar13);
  free(ppVVar11);
  free(local_a8);
  free(local_98);
  free(local_b0);
  free(local_a0);
  free(local_70);
  free(vPiValues);
  free(local_60);
  free(local_78);
  if (ppVVar9 == (Vec_Ptr_t **)0x0) {
    return;
  }
  free(ppVVar9);
  free(local_90);
  return;
}

Assistant:

void bmGateWay( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int p_equivalence )
{	
	Vec_Int_t ** iDep1, ** oDep1;
	Vec_Int_t ** iDep2, ** oDep2;
	Vec_Int_t ** iMatch1, ** oMatch1;
	Vec_Int_t ** iMatch2, ** oMatch2;		
	int * iGroup1, * oGroup1;
	int * iGroup2, * oGroup2;
	int iLastItem1, oLastItem1;
	int iLastItem2, oLastItem2;	
	int i, j;	
	
	char * vPiValues1, * vPiValues2;
	int * observability1, * observability2;
	abctime clk = Abc_Clock();
	float initTime;
	float simulTime;
	float satTime;
	Vec_Ptr_t ** topOrder1 = NULL, ** topOrder2 = NULL;

	extern void getDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep);
	extern void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence);		
	extern void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup);
	extern void oSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, int* iGroup);
	extern int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup);
	extern int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup);	
	extern Vec_Ptr_t ** findTopologicalOrder(Abc_Ntk_t * pNtk);
	extern int refineIOBySimulation(Abc_Ntk_t *pNtk, Vec_Int_t** iMatch, int* iLastItem, int * iGroup, Vec_Int_t** iDep, Vec_Int_t** oMatch, int* oLastItem, int * oGroup, Vec_Int_t** oDep, char * vPiValues, int * observability, Vec_Ptr_t ** topOrder);	
	extern float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
							Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2);				
	int checkListConsistency(Vec_Int_t ** iMatch1, Vec_Int_t ** oMatch1, Vec_Int_t ** iMatch2, Vec_Int_t ** oMatch2, int iLastItem1, int oLastItem1, int iLastItem2, int oLastItem2);	

	iDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
	oDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

	iDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
	oDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );

	iMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
	oMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

	iMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
	oMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );		

	iGroup1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
	oGroup1 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk1) );

	iGroup2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );
	oGroup2 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk2) );

	vPiValues1 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk1) + 1);
	vPiValues1[Abc_NtkPiNum(pNtk1)] = '\0';	

	vPiValues2 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk2) + 1);
	vPiValues2[Abc_NtkPiNum(pNtk2)] = '\0';	

	observability1 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk1));
	observability2 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk2));

	for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
	{		
		iDep1[i] = Vec_IntAlloc( 1 );
		iMatch1[i] = Vec_IntAlloc( 1 );

		iDep2[i] = Vec_IntAlloc( 1 );
		iMatch2[i] = Vec_IntAlloc( 1 );

		vPiValues1[i] = '0';
		vPiValues2[i] = '0';

		observability1[i] = 0;
		observability2[i] = 0;
	}

	for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
	{
		oDep1[i] = Vec_IntAlloc( 1 );
		oMatch1[i] = Vec_IntAlloc( 1 );

		oDep2[i] = Vec_IntAlloc( 1 );
		oMatch2[i] = Vec_IntAlloc( 1 );
	}	
	
	/************* Strashing ************/	
	pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );	
	pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );			
	printf("Network  strashing is done!\n");	
	/************************************/	
	
	/******* Getting Dependencies *******/	
	getDependencies(pNtk1, iDep1, oDep1);
	getDependencies(pNtk2, iDep2, oDep2);			
	printf("Getting dependencies is done!\n");	
	/************************************/

	/***** Intializing match lists ******/	
	initMatchList(pNtk1, iDep1, oDep1, iMatch1, &iLastItem1, oMatch1, &oLastItem1, iGroup1, oGroup1, p_equivalence);			
	initMatchList(pNtk2, iDep2, oDep2, iMatch2, &iLastItem2, oMatch2, &oLastItem2, iGroup2, oGroup2, p_equivalence);	
	printf("Initializing match lists is done!\n");		
	/************************************/

	if( !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2) )
	{
		fprintf( stdout, "I/O dependencies of two circuits are different.\n");
		goto freeAndExit;
	}		

	printf("Refining IOs by dependencies ...");				
	// split match lists further by checking dependencies
	do
	{
		int iNumOfItemsAdded = 1, oNumOfItemsAdded = 1;		

		do
		{	
			if( oNumOfItemsAdded )
			{
				iSortDependencies(pNtk1, iDep1, oGroup1);
				iSortDependencies(pNtk2, iDep2, oGroup2);
			}
			
			if( iNumOfItemsAdded )
			{
				oSortDependencies(pNtk1, oDep1, iGroup1);
				oSortDependencies(pNtk2, oDep2, iGroup2);
			}

			if( iLastItem1 < Abc_NtkPiNum(pNtk1) )
			{				
				iSplitByDep(pNtk1, iDep1, iMatch1, iGroup1, &iLastItem1, oGroup1);
				if( oLastItem1 < Abc_NtkPoNum(pNtk1) )
					oSplitByDep(pNtk1, oDep1, oMatch1, oGroup1, &oLastItem1, iGroup1);
			}				

			if( iLastItem2 < Abc_NtkPiNum(pNtk2) )
				iNumOfItemsAdded = iSplitByDep(pNtk2, iDep2, iMatch2, iGroup2, &iLastItem2, oGroup2);
			else
				iNumOfItemsAdded = 0;	
				
			if( oLastItem2 < Abc_NtkPoNum(pNtk2) )		
				oNumOfItemsAdded = oSplitByDep(pNtk2, oDep2, oMatch2, oGroup2, &oLastItem2, iGroup2);
			else
				oNumOfItemsAdded = 0;
			
			if(!checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
			{
				fprintf( stdout, "I/O dependencies of two circuits are different.\n");
				goto freeAndExit;
			}		
		}while(iNumOfItemsAdded != 0 || oNumOfItemsAdded != 0);

	}while(0);

	printf(" done!\n");

	initTime = ((float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC));	
	clk = Abc_Clock();

	topOrder1 = findTopologicalOrder(pNtk1);
	topOrder2 = findTopologicalOrder(pNtk2);

	printf("Refining IOs by simulation ...");				

	do
	{
		int counter = 0;
		int ioSuccess1, ioSuccess2;	
		
		do
		{
			for(i = 0; i < iLastItem1; i++)
			{
				int temp = (int)(SIM_RANDOM_UNSIGNED % 2);		
				
				if(Vec_IntSize(iMatch1[i]) != Vec_IntSize(iMatch2[i]))
				{
					fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");				
					goto freeAndExit;
				}
				
				for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
				{
					vPiValues1[Vec_IntEntry(iMatch1[i], j)] = temp + '0';
					vPiValues2[Vec_IntEntry(iMatch2[i], j)] = temp + '0';	
				}			
			}					
			
			ioSuccess1 = refineIOBySimulation(pNtk1, iMatch1, &iLastItem1, iGroup1, iDep1, oMatch1, &oLastItem1, oGroup1, oDep1, vPiValues1, observability1, topOrder1);				
			ioSuccess2 = refineIOBySimulation(pNtk2, iMatch2, &iLastItem2, iGroup2, iDep2, oMatch2, &oLastItem2, oGroup2, oDep2, vPiValues2, observability2, topOrder2);
			
			if(ioSuccess1 && ioSuccess2)
				counter = 0;
			else
				counter++;						
			
			if(ioSuccess1 != ioSuccess2 ||
			   !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
			{
				fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");				
				goto freeAndExit;
			}
		}while(counter <= 200);				
		
	}while(0);	

	printf(" done!\n");
	
	simulTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);
	printf("SAT-based search started ...\n");

	satTime = refineBySAT(pNtk1, iMatch1, iGroup1, iDep1, &iLastItem1, oMatch1, oGroup1, oDep1, &oLastItem1, observability1,
		   					   pNtk2, iMatch2, iGroup2, iDep2, &iLastItem2, oMatch2, oGroup2, oDep2, &oLastItem2, observability2);

	printf( "Init Time = %4.2f\n", initTime );	
	printf( "Simulation Time = %4.2f\n", simulTime );
	printf( "SAT Time = %4.2f\n", satTime );
	printf( "Overall Time = %4.2f\n", initTime + simulTime + satTime );
	
freeAndExit:

	for(i = 0; i < iLastItem1 ; i++)
	{			
		
		Vec_IntFree( iMatch1[i] );
		Vec_IntFree( iMatch2[i] );
	}
	
	for(i = 0; i < oLastItem1 ; i++)
	{			
		
		Vec_IntFree( oMatch1[i] );
		Vec_IntFree( oMatch2[i] );
	}

	for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
	{
		Vec_IntFree( iDep1[i] );
		Vec_IntFree( iDep2[i] );
		if(topOrder1 != NULL) {
			Vec_PtrFree( topOrder1[i] );
			Vec_PtrFree( topOrder2[i] );
		}
	}

	for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
	{
		Vec_IntFree( oDep1[i] );
		Vec_IntFree( oDep2[i] );
	}

	ABC_FREE( iMatch1 );
	ABC_FREE( iMatch2 );
	ABC_FREE( oMatch1 );
	ABC_FREE( oMatch2 );
	ABC_FREE( iDep1 );
	ABC_FREE( iDep2 );
	ABC_FREE( oDep1 );
	ABC_FREE( oDep2 );
	ABC_FREE( iGroup1 );
	ABC_FREE( iGroup2 );
	ABC_FREE( oGroup1 );
	ABC_FREE( oGroup2 );	
	ABC_FREE( vPiValues1 );
	ABC_FREE( vPiValues2 );
	ABC_FREE( observability1 );
	ABC_FREE( observability2 );
	if(topOrder1 != NULL) {
		ABC_FREE( topOrder1 );
		ABC_FREE( topOrder2 );
	}
}